

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enumbuilder.cpp
# Opt level: O2

EnumBuilder * __thiscall camp::EnumBuilder::value(EnumBuilder *this,string *name,long value)

{
  uint __line;
  bool bVar1;
  char *__assertion;
  Pair pair;
  
  bVar1 = Enum::hasName(this->m_target,name);
  if (bVar1) {
    __assertion = "!m_target->hasName(name)";
    __line = 0x2f;
  }
  else {
    bVar1 = Enum::hasValue(this->m_target,value);
    if (!bVar1) {
      pair.name._M_dataplus._M_p = (pointer)&pair.name.field_2;
      pair.name._M_string_length = 0;
      pair.name.field_2._M_local_buf[0] = '\0';
      std::__cxx11::string::_M_assign((string *)&pair);
      pair.value = value;
      boost::multi_index::detail::
      random_access_index<boost::multi_index::detail::nth_layer<1,_camp::Enum::Pair,_boost::multi_index::indexed_by<boost::multi_index::random_access<boost::multi_index::tag<camp::Enum::Id,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>_>,_boost::multi_index::ordered_unique<boost::multi_index::tag<camp::Enum::Val,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::member<camp::Enum::Pair,_long,_&camp::Enum::Pair::value>,_mpl_::na>,_boost::multi_index::ordered_unique<boost::multi_index::tag<camp::Enum::Name,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::member<camp::Enum::Pair,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&camp::Enum::Pair::name>,_mpl_::na>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<camp::Enum::Pair>_>,_boost::mpl::v_item<camp::Enum::Id,_boost::mpl::vector0<mpl_::na>,_0>_>
      ::push_back(&(this->m_target->m_pairs).super_type,&pair);
      std::__cxx11::string::~string((string *)&pair);
      return this;
    }
    __assertion = "!m_target->hasValue(value)";
    __line = 0x30;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/fw4spl-org[P]camp/src/enumbuilder.cpp"
                ,__line,"EnumBuilder &camp::EnumBuilder::value(const std::string &, long)");
}

Assistant:

EnumBuilder& EnumBuilder::value(const std::string& name, long value)
{
    assert(!m_target->hasName(name));
    assert(!m_target->hasValue(value));

    Enum::Pair pair;
    pair.name = name;
    pair.value = value;
    m_target->m_pairs.push_back(pair);

    return *this;
}